

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O1

CURLcode ftp_do(Curl_easy *data,_Bool *done)

{
  byte *pbVar1;
  connectdata *pcVar2;
  WildcardData *pWVar3;
  undefined8 *puVar4;
  FILEPROTO *pFVar5;
  WildcardData *pWVar6;
  connectdata *pcVar7;
  bool bVar8;
  uchar uVar9;
  byte bVar10;
  _Bool connected;
  CURLcode CVar11;
  CURLcode CVar12;
  char *pcVar13;
  long lVar14;
  char *pcVar15;
  ftp_wc *pfVar16;
  ftp_parselist_data *pfVar17;
  int iVar18;
  CURLcode unaff_EBP;
  
  pcVar2 = data->conn;
  *done = false;
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 & 0xdf;
  if (((data->state).field_0x74c & 0x40) != 0) {
    pWVar3 = data->wildcard;
    pcVar2 = data->conn;
    CVar12 = CURLE_OK;
switchD_006a0b0b_default:
    switch(pWVar3->state) {
    case '\0':
    case '\x06':
    case '\a':
      goto switchD_006a0b0b_caseD_0;
    case '\x01':
      pFVar5 = (data->req).p.file;
      pcVar13 = pFVar5->path;
      pWVar6 = data->wildcard;
      pcVar15 = strrchr(pcVar13,0x2f);
      if (pcVar15 == (char *)0x0) {
        if (*pcVar13 != '\0') {
          pcVar15 = (*Curl_cstrdup)(pcVar13);
          pWVar6->pattern = pcVar15;
          goto LAB_006a0e28;
        }
LAB_006a0f15:
        pWVar6->state = '\x04';
        unaff_EBP = ftp_parse_url_path(data);
      }
      else {
        if (pcVar15[1] == '\0') goto LAB_006a0f15;
        pcVar13 = pcVar15 + 1;
        pcVar15 = (*Curl_cstrdup)(pcVar13);
        pWVar6->pattern = pcVar15;
LAB_006a0e28:
        if (pcVar15 == (char *)0x0) {
          unaff_EBP = CURLE_OUT_OF_MEMORY;
        }
        else {
          *pcVar13 = '\0';
          pfVar16 = (ftp_wc *)(*Curl_ccalloc)(1,0x18);
          unaff_EBP = CURLE_OUT_OF_MEMORY;
          if (pfVar16 != (ftp_wc *)0x0) {
            pfVar17 = Curl_ftp_parselist_data_alloc();
            pfVar16->parser = pfVar17;
            if (pfVar17 != (ftp_parselist_data *)0x0) {
              pWVar6->ftpwc = pfVar16;
              pWVar6->dtor = wc_data_dtor;
              if ((data->set).ftp_filemethod == '\x02') {
                (data->set).ftp_filemethod = '\x01';
              }
              unaff_EBP = ftp_parse_url_path(data);
              if (unaff_EBP == CURLE_OK) {
                pcVar13 = (*Curl_cstrdup)(pFVar5->path);
                pWVar6->path = pcVar13;
                unaff_EBP = CURLE_OUT_OF_MEMORY;
                if (pcVar13 != (char *)0x0) {
                  unaff_EBP = CURLE_OK;
                  (pfVar16->backup).write_function = (data->set).fwrite_func;
                  (data->set).fwrite_func = Curl_ftp_parselist;
                  (pfVar16->backup).file_descriptor = (FILE *)(data->set).out;
                  (data->set).out = data;
                  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                    unaff_EBP = CURLE_OK;
                    Curl_infof(data,"Wildcard - Parsing started");
                  }
                  goto LAB_006a0f6b;
                }
              }
            }
          }
          if (pfVar16 != (ftp_wc *)0x0) {
            Curl_ftp_parselist_data_free((ftp_parselist_data **)pfVar16);
            (*Curl_cfree)(pfVar16);
          }
          (*Curl_cfree)(pWVar6->pattern);
          pWVar6->pattern = (char *)0x0;
          pWVar6->ftpwc = (ftp_wc *)0x0;
          pWVar6->dtor = (wildcard_dtor)0x0;
        }
      }
LAB_006a0f6b:
      if (pWVar3->state == '\x04') goto LAB_006a0f80;
      bVar10 = (unaff_EBP != CURLE_OK) << 2 | 2;
      break;
    case '\x02':
      pfVar16 = pWVar3->ftpwc;
      (data->set).fwrite_func = (pfVar16->backup).write_function;
      (data->set).out = (pfVar16->backup).file_descriptor;
      (pfVar16->backup).write_function = (curl_write_callback)0x0;
      (pfVar16->backup).file_descriptor = (FILE *)0x0;
      pWVar3->state = '\x03';
      CVar11 = Curl_ftp_parselist_geterror(pfVar16->parser);
      if (CVar11 == CURLE_OK) {
        bVar8 = true;
        if ((pWVar3->filelist).size == 0) {
          unaff_EBP = CURLE_REMOTE_FILE_NOT_FOUND;
          goto LAB_006a0b94;
        }
      }
      else {
LAB_006a0b94:
        pWVar3->state = '\x04';
        bVar8 = CVar11 != CURLE_OK;
      }
      if (!bVar8) goto LAB_006a0f80;
      goto switchD_006a0b0b_default;
    case '\x03':
      puVar4 = (undefined8 *)((pWVar3->filelist).head)->ptr;
      pFVar5 = (data->req).p.file;
      pcVar13 = curl_maprintf("%s%s",pWVar3->path,*puVar4);
      iVar18 = 1;
      if (pcVar13 == (char *)0x0) {
        unaff_EBP = CURLE_OUT_OF_MEMORY;
      }
      else {
        (*Curl_cfree)(pFVar5->freepath);
        pFVar5->path = pcVar13;
        pFVar5->freepath = pcVar13;
        if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
          Curl_infof(data,"Wildcard - START of \"%s\"",*puVar4);
        }
        if ((data->set).chunk_bgn != (curl_chunk_bgn_callback)0x0) {
          Curl_set_in_callback(data,true);
          lVar14 = (*(data->set).chunk_bgn)
                             (puVar4,(data->set).wildcardptr,(int)(pWVar3->filelist).size);
          Curl_set_in_callback(data,false);
          if (lVar14 == 1) {
            unaff_EBP = CURLE_CHUNK_FAILED;
            iVar18 = 1;
LAB_006a0cfb:
            bVar8 = false;
          }
          else {
            if (lVar14 == 2) {
              if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
                Curl_infof(data,"Wildcard - \"%s\" skipped by user",*puVar4);
              }
              pWVar3->state = '\x05';
              iVar18 = 3;
              goto LAB_006a0cfb;
            }
            iVar18 = 0;
            bVar8 = true;
          }
          if (!bVar8) goto LAB_006a0d72;
        }
        if (*(int *)(puVar4 + 1) == 0) {
          if ((*(byte *)(puVar4 + 0xc) & 0x40) != 0) {
            (pcVar2->proto).ftpc.known_filesize = puVar4[5];
          }
          unaff_EBP = ftp_parse_url_path(data);
          iVar18 = 1;
          CVar12 = unaff_EBP;
          if (unaff_EBP == CURLE_OK) {
            CVar12 = CURLE_OK;
            Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
            iVar18 = 1;
            if ((pWVar3->filelist).size == 0) {
              uVar9 = '\x04';
              unaff_EBP = CURLE_OK;
              goto LAB_006a0d1d;
            }
            unaff_EBP = CURLE_OK;
          }
        }
        else {
          iVar18 = 3;
          uVar9 = '\x05';
LAB_006a0d1d:
          pWVar3->state = uVar9;
        }
      }
LAB_006a0d72:
      if (iVar18 != 3) goto LAB_006a0f80;
      goto switchD_006a0b0b_default;
    case '\x04':
      if (pWVar3->ftpwc == (ftp_wc *)0x0) {
        unaff_EBP = CURLE_OK;
      }
      else {
        unaff_EBP = Curl_ftp_parselist_geterror(pWVar3->ftpwc->parser);
      }
      bVar10 = unaff_EBP == CURLE_OK | 6;
      break;
    case '\x05':
      goto switchD_006a0b0b_caseD_5;
    default:
      goto switchD_006a0b0b_default;
    }
    pWVar3->state = bVar10;
    goto LAB_006a0f80;
  }
  unaff_EBP = ftp_parse_url_path(data);
joined_r0x006a0fa1:
  if (unaff_EBP != CURLE_OK) {
    return unaff_EBP;
  }
  pcVar2 = data->conn;
  (data->req).size = -1;
  Curl_pgrsSetUploadCounter(data,0);
  Curl_pgrsSetDownloadCounter(data,0);
  Curl_pgrsSetUploadSize(data,-1);
  Curl_pgrsSetDownloadSize(data,-1);
  pbVar1 = (byte *)((long)&pcVar2->proto + 0x112);
  *pbVar1 = *pbVar1 | 4;
  if (((data->req).field_0xbc & 0x10) != 0) {
    ((data->req).p.file)->fd = 1;
  }
  *done = false;
  CVar12 = ftp_state_quote(data,true,'\f');
  if (CVar12 == CURLE_OK) {
    pcVar7 = data->conn;
    CVar12 = Curl_pp_statemach(data,&(pcVar7->proto).ftpc.pp,false,false);
    *done = (pcVar7->proto).ftpc.state == '\0';
    connected = Curl_conn_is_connected(data->conn,1);
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      Curl_infof(data,"ftp_perform ends with SECONDARY: %d",(ulong)connected);
    }
  }
  else {
    connected = false;
  }
  if (CVar12 == CURLE_OK) {
    if (*done != true) {
      return CURLE_OK;
    }
    CVar12 = ftp_dophase_done(data,connected);
    return CVar12;
  }
  freedirs(&(pcVar2->proto).ftpc);
  return CVar12;
switchD_006a0b0b_caseD_5:
  if ((data->set).chunk_end != (curl_chunk_end_callback)0x0) {
    Curl_set_in_callback(data,true);
    (*(data->set).chunk_end)((data->set).wildcardptr);
    Curl_set_in_callback(data,false);
  }
  Curl_llist_remove(&pWVar3->filelist,(pWVar3->filelist).head,(void *)0x0);
  pWVar3->state = ((pWVar3->filelist).size == 0) + '\x03';
  goto switchD_006a0b0b_default;
switchD_006a0b0b_caseD_0:
  unaff_EBP = CVar12;
  if (pWVar3->dtor != (wildcard_dtor)0x0) {
    (*pWVar3->dtor)(pWVar3->ftpwc);
    pWVar3->ftpwc = (ftp_wc *)0x0;
  }
LAB_006a0f80:
  if ((data->wildcard->state | 2) == 7) {
    return CURLE_OK;
  }
  goto joined_r0x006a0fa1;
}

Assistant:

static CURLcode ftp_do(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  *done = FALSE; /* default to false */
  ftpc->wait_data_conn = FALSE; /* default to no such wait */

  if(data->state.wildcardmatch) {
    result = wc_statemach(data);
    if(data->wildcard->state == CURLWC_SKIP ||
       data->wildcard->state == CURLWC_DONE) {
      /* do not call ftp_regular_transfer */
      return CURLE_OK;
    }
    if(result) /* error, loop or skipping the file */
      return result;
  }
  else { /* no wildcard FSM needed */
    result = ftp_parse_url_path(data);
    if(result)
      return result;
  }

  result = ftp_regular_transfer(data, done);

  return result;
}